

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5GetTokenizer
              (Fts5Global *pGlobal,char **azArg,int nArg,Fts5Tokenizer **ppTok,
              fts5_tokenizer **ppTokApi,char **pzErr)

{
  int iVar1;
  Fts5TokenizerModule *pFVar2;
  char *pcVar3;
  
  if (nArg == 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = *azArg;
  }
  pFVar2 = fts5LocateTokenizer(pGlobal,pcVar3);
  if (pFVar2 == (Fts5TokenizerModule *)0x0) {
    pcVar3 = sqlite3_mprintf("no such tokenizer: %s",*azArg);
    iVar1 = 1;
  }
  else {
    iVar1 = nArg + -1;
    if (nArg == 0) {
      iVar1 = 0;
    }
    iVar1 = (*(pFVar2->x).xCreate)(pFVar2->pUserData,azArg + 1,iVar1,ppTok);
    *ppTokApi = &pFVar2->x;
    if ((pzErr == (char **)0x0) || (iVar1 == 0)) {
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001b55b7;
    }
    pcVar3 = sqlite3_mprintf("error in tokenizer constructor");
  }
  *pzErr = pcVar3;
LAB_001b55b7:
  *ppTokApi = (fts5_tokenizer *)0x0;
  *ppTok = (Fts5Tokenizer *)0x0;
  return iVar1;
}

Assistant:

static int sqlite3Fts5GetTokenizer(
  Fts5Global *pGlobal, 
  const char **azArg,
  int nArg,
  Fts5Tokenizer **ppTok,
  fts5_tokenizer **ppTokApi,
  char **pzErr
){
  Fts5TokenizerModule *pMod;
  int rc = SQLITE_OK;

  pMod = fts5LocateTokenizer(pGlobal, nArg==0 ? 0 : azArg[0]);
  if( pMod==0 ){
    assert( nArg>0 );
    rc = SQLITE_ERROR;
    *pzErr = sqlite3_mprintf("no such tokenizer: %s", azArg[0]);
  }else{
    rc = pMod->x.xCreate(pMod->pUserData, &azArg[1], (nArg?nArg-1:0), ppTok);
    *ppTokApi = &pMod->x;
    if( rc!=SQLITE_OK && pzErr ){
      *pzErr = sqlite3_mprintf("error in tokenizer constructor");
    }
  }

  if( rc!=SQLITE_OK ){
    *ppTokApi = 0;
    *ppTok = 0;
  }

  return rc;
}